

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator::GenerateMembers
          (ImmutablePrimitiveFieldLiteGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  FieldDescriptor *pFVar1;
  Context *pCVar2;
  pointer pcVar3;
  bool bVar4;
  JavaType JVar5;
  OneofDescriptor *pOVar6;
  char *pcVar7;
  size_t sVar8;
  string_view begin_varname;
  string_view begin_varname_00;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view end_varname;
  string_view end_varname_00;
  undefined1 local_180 [8];
  _Alloc_hider local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Alloc_hider local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  undefined2 local_138;
  undefined1 local_130 [8];
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined2 local_e8;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined2 local_98;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  
  bVar4 = IsByteStringWithCustomDefaultValue(this->descriptor_);
  if (bVar4) {
    text._M_str = "private static final $field_type$ $bytes_default$ = $default$;\n";
    text._M_len = 0x3f;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&this->variables_,text);
  }
  if ((this->context_->options_).opensource_runtime == false) {
    text_00._M_str = "@com.google.protobuf.ProtoField(\n  isRequired=$required$)\n";
    text_00._M_len = 0x3a;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&this->variables_,text_00);
    pFVar1 = this->descriptor_;
    bVar4 = FieldDescriptor::has_presence(pFVar1);
    if (bVar4) {
      if ((pFVar1->field_0x3 & 1) != 0) {
        if ((pFVar1->field_0x1 & 0x10) == 0) {
          pOVar6 = (OneofDescriptor *)0x0;
        }
        else {
          pOVar6 = (pFVar1->scope_).containing_oneof;
          if (pOVar6 == (OneofDescriptor *)0x0) {
            protobuf::internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb31);
          }
        }
        if (pOVar6 == (OneofDescriptor *)0x0) {
LAB_00edacf6:
          protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb63);
        }
        if ((pOVar6->field_count_ == 1) && ((pOVar6->fields_->field_0x1 & 2) != 0)) {
          GenerateMembers();
          goto LAB_00edacf6;
        }
        if ((pFVar1->field_0x3 & 1) != 0) goto LAB_00eda886;
      }
      text_01._M_str =
           "@com.google.protobuf.ProtoPresenceCheckedField(\n  presenceBitsId=$bit_field_id$,\n  mask=$bit_field_mask$)\n"
      ;
      text_01._M_len = 0x6a;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&this->variables_,text_01);
    }
  }
LAB_00eda886:
  vars = &this->variables_;
  text_02._M_str = "private $field_type$ $name$_;\n";
  text_02._M_len = 0x1e;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_02);
  PrintExtraFieldInfo(vars,printer);
  bVar4 = FieldDescriptor::has_presence(this->descriptor_);
  if (bVar4) {
    pFVar1 = this->descriptor_;
    pCVar2 = this->context_;
    local_90[4] = (pCVar2->options_).opensource_runtime;
    local_90[5] = (pCVar2->options_).annotate_code;
    local_90[0] = (pCVar2->options_).generate_immutable_code;
    local_90[1] = (pCVar2->options_).generate_mutable_code;
    local_90[2] = (pCVar2->options_).generate_shared_code;
    local_90[3] = (pCVar2->options_).enforce_lite;
    local_88._M_p = (pointer)&local_78;
    pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar3,
               pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
    pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
    local_68._M_p = (pointer)local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar3,
               pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
    local_58[1]._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
    local_58[1]._1_1_ = (pCVar2->options_).jvm_dsl;
    WriteFieldAccessorDocComment(printer,pFVar1,HAZZER,(Options *)local_90,false,false,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != local_58) {
      operator_delete(local_68._M_p,local_58[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_p != &local_78) {
      operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
    }
    text_03._M_str =
         "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $is_field_present_message$;\n}\n"
    ;
    text_03._M_len = 0x77;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_03);
    begin_varname._M_str = "{";
    begin_varname._M_len = 1;
    end_varname._M_str = "}";
    end_varname._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname,end_varname,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  }
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_e0[4] = (pCVar2->options_).opensource_runtime;
  local_e0[5] = (pCVar2->options_).annotate_code;
  local_e0[0] = (pCVar2->options_).generate_immutable_code;
  local_e0[1] = (pCVar2->options_).generate_mutable_code;
  local_e0[2] = (pCVar2->options_).generate_shared_code;
  local_e0[3] = (pCVar2->options_).enforce_lite;
  local_d8._M_p = (pointer)&local_c8;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_b8._M_p = (pointer)&local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_98._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_98._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment(printer,pFVar1,GETTER,(Options *)local_e0,false,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
  }
  text_04._M_str =
       "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n  return $name$_;\n}\n"
  ;
  text_04._M_len = 99;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_04);
  begin_varname_00._M_str = "{";
  begin_varname_00._M_len = 1;
  end_varname_00._M_str = "}";
  end_varname_00._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_00,end_varname_00,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_130[4] = (pCVar2->options_).opensource_runtime;
  local_130[5] = (pCVar2->options_).annotate_code;
  local_130[0] = (pCVar2->options_).generate_immutable_code;
  local_130[1] = (pCVar2->options_).generate_mutable_code;
  local_130[2] = (pCVar2->options_).generate_shared_code;
  local_130[3] = (pCVar2->options_).enforce_lite;
  local_128._M_p = (pointer)&local_118;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_108._M_p = (pointer)&local_f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_e8._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_e8._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment(printer,pFVar1,SETTER,(Options *)local_130,false,false,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_p != &local_118) {
    operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
  }
  text_05._M_str =
       "private void set$capitalized_name$($type$ value) {\n$null_check$  $set_has_field_bit_message$\n  $name$_ = value;\n}\n"
  ;
  text_05._M_len = 0x72;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_05);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_180[4] = (pCVar2->options_).opensource_runtime;
  local_180[5] = (pCVar2->options_).annotate_code;
  local_180[0] = (pCVar2->options_).generate_immutable_code;
  local_180[1] = (pCVar2->options_).generate_mutable_code;
  local_180[2] = (pCVar2->options_).generate_shared_code;
  local_180[3] = (pCVar2->options_).enforce_lite;
  local_178._M_p = (pointer)&local_168;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_158._M_p = (pointer)&local_148;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_138._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_138._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment(printer,pFVar1,CLEARER,(Options *)local_180,false,false,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_p != &local_148) {
    operator_delete(local_158._M_p,local_148._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_p != &local_168) {
    operator_delete(local_178._M_p,local_168._M_allocated_capacity + 1);
  }
  text_06._M_str = "private void clear$capitalized_name$() {\n  $clear_has_field_bit_message$\n";
  text_06._M_len = 0x49;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_06);
  JVar5 = GetJavaType(this->descriptor_);
  if (JVar5 - JAVATYPE_STRING < 2) {
    pcVar7 = "  $name$_ = getDefaultInstance().get$capitalized_name$();\n";
    sVar8 = 0x3a;
  }
  else {
    pcVar7 = "  $name$_ = $default$;\n";
    sVar8 = 0x17;
  }
  text_07._M_str = pcVar7;
  text_07._M_len = sVar8;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_07);
  text_08._M_str = "}\n";
  text_08._M_len = 2;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_08);
  return;
}

Assistant:

void ImmutablePrimitiveFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  if (IsByteStringWithCustomDefaultValue(descriptor_)) {
    // allocate this once statically since we know ByteStrings are immutable
    // values that can be reused.
    printer->Print(
        variables_,
        "private static final $field_type$ $bytes_default$ = $default$;\n");
  }
  if (!context_->options().opensource_runtime) {
    printer->Print(variables_,
                   "@com.google.protobuf.ProtoField(\n"
                   "  isRequired=$required$)\n");
    if (HasHasbit(descriptor_)) {
      printer->Print(variables_,
                     "@com.google.protobuf.ProtoPresenceCheckedField(\n"
                     "  presenceBitsId=$bit_field_id$,\n"
                     "  mask=$bit_field_mask$)\n");
    }
  }
  printer->Print(variables_, "private $field_type$ $name$_;\n");
  PrintExtraFieldInfo(variables_, printer);
  if (descriptor_->has_presence()) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                                 context_->options());
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
        "  return $is_field_present_message$;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  return $name$_;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "private void set$capitalized_name$($type$ value) {\n"
                 "$null_check$"
                 "  $set_has_field_bit_message$\n"
                 "  $name$_ = value;\n"
                 "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "private void clear$capitalized_name$() {\n"
                 "  $clear_has_field_bit_message$\n");
  JavaType type = GetJavaType(descriptor_);
  if (type == JAVATYPE_STRING || type == JAVATYPE_BYTES) {
    // The default value is not a simple literal so we want to avoid executing
    // it multiple times.  Instead, get the default out of the default instance.
    printer->Print(
        variables_,
        "  $name$_ = getDefaultInstance().get$capitalized_name$();\n");
  } else {
    printer->Print(variables_, "  $name$_ = $default$;\n");
  }
  printer->Print(variables_, "}\n");
}